

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# router.cpp
# Opt level: O2

void floodRoutingTablePacket(void)

{
  pointer pLVar1;
  Link *link;
  pointer pLVar2;
  sockaddr_in sVar3;
  sockaddr_in router_address;
  packet_t tablePacket;
  
  makeTableIntoPacket_abi_cxx11_();
  pLVar1 = links.super__Vector_base<Link,_std::allocator<Link>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  for (pLVar2 = links.super__Vector_base<Link,_std::allocator<Link>_>._M_impl.
                super__Vector_impl_data._M_start; pLVar2 != pLVar1; pLVar2 = pLVar2 + 1) {
    sVar3 = getInetSocketAddress((pLVar2->neighbor)._M_dataplus._M_p,0x128b,2);
    router_address._0_8_ = sVar3._0_8_;
    router_address.sin_zero[0] = '\0';
    router_address.sin_zero[1] = '\0';
    router_address.sin_zero[2] = '\0';
    router_address.sin_zero[3] = '\0';
    router_address.sin_zero[4] = '\0';
    router_address.sin_zero[5] = '\0';
    router_address.sin_zero[6] = '\0';
    router_address.sin_zero[7] = '\0';
    Socket::writeString(&socketLocal,&router_address,&tablePacket);
  }
  std::__cxx11::string::~string((string *)&tablePacket);
  return;
}

Assistant:

void floodRoutingTablePacket() {
	auto tablePacket = makeTableIntoPacket();
//	for (const auto &neighbor:neighbors) {
//		sockaddr_in router_address = getInetSocketAddress(neighbor.data(), 4747);
//		socketLocal.writeString(router_address, tablePacket);
//	}
	for (const auto &link:links) {
		sockaddr_in router_address = getInetSocketAddress(link.neighbor.data(), 4747);
		socketLocal.writeString(router_address, tablePacket);
	}
}